

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O1

void __thiscall
mp::
TypedSolverOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::Parse(TypedSolverOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,char **s,bool splitString)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  string local_50;
  
  local_88 = 0;
  local_80 = 0;
  local_90 = &local_80;
  internal::
  OptionHelper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parse(&local_50,s,splitString);
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (*(this->super_SolverOption)._vptr_SolverOption[9])(this,local_90,local_88);
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  return;
}

Assistant:

void Parse(const char *&s, bool splitString=false) override {
    const char *start = s;
    T value;
    try {
      value = internal::OptionHelper<T>::Parse(s, splitString);
    } catch (const std::exception& exc) {
      // undocumented: we accept next option after a numeric option
      s = SkipNonSpaces(s);
      throw InvalidOptionValue(name(),
                               std::string(start, s - start),
                               exc.what());
    }
    SetValue(value);
  }